

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

errr finish_parse_meth(parser *p)

{
  blow_method *pbVar1;
  int local_24;
  wchar_t count;
  blow_method *next;
  blow_method *meth;
  parser *p_local;
  
  local_24 = 1;
  z_info->blow_methods_max = 0;
  for (next = (blow_method *)parser_priv(p); next != (blow_method *)0x0; next = next->next) {
    z_info->blow_methods_max = z_info->blow_methods_max + 1;
  }
  blow_methods = (blow_method *)mem_zalloc((long)(int)(z_info->blow_methods_max + 1) * 0x30);
  next = (blow_method *)parser_priv(p);
  while (next != (blow_method *)0x0) {
    memcpy(blow_methods + local_24,next,0x30);
    pbVar1 = next->next;
    if (pbVar1 == (blow_method *)0x0) {
      blow_methods[local_24].next = (blow_method *)0x0;
    }
    else {
      blow_methods[local_24].next = blow_methods + (local_24 + 1);
    }
    mem_free(next);
    local_24 = local_24 + 1;
    next = pbVar1;
  }
  z_info->blow_methods_max = z_info->blow_methods_max + 1;
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_meth(struct parser *p) {
	struct blow_method *meth, *next = NULL;
	int count = 1;

	/* Count the entries */
	z_info->blow_methods_max = 0;
	meth = parser_priv(p);
	while (meth) {
		z_info->blow_methods_max++;
		meth = meth->next;
	}

	/* Allocate the direct access list and copy the data to it */
	blow_methods = mem_zalloc((z_info->blow_methods_max + 1) * sizeof(*meth));
	for (meth = parser_priv(p); meth; meth = next, count++) {
		memcpy(&blow_methods[count], meth, sizeof(*meth));
		next = meth->next;
		if (next)
			blow_methods[count].next = &blow_methods[count + 1];
		else
			blow_methods[count].next = NULL;

		mem_free(meth);
	}
	z_info->blow_methods_max += 1;

	parser_destroy(p);
	return 0;
}